

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O3

void __thiscall OpenMD::HydroProp::complete(HydroProp *this)

{
  if (this->hasXi_ == true) {
    CholeskyDecomposition<OpenMD::SquareMatrix<double,6>>(&this->Xi_,&this->S_);
    this->hasS_ = true;
    return;
  }
  builtin_strncpy(painCave.errMsg + 0x30,"ance Tensor.\n",0xe);
  builtin_strncpy(painCave.errMsg + 0x20,"without a Resist",0x10);
  builtin_strncpy(painCave.errMsg + 0x10,"ked to complete ",0x10);
  builtin_strncpy(painCave.errMsg,"HydroProp was as",0x10);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return;
}

Assistant:

void HydroProp::complete() {
    if (hasXi_) {
      CholeskyDecomposition(Xi_, S_);
      hasS_ = true;
    } else {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "HydroProp was asked to complete without a Resistance Tensor.\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }